

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O0

void * xmlCopyEntity(void *payload,xmlChar *name)

{
  xmlEntityPtr entity;
  xmlChar *pxVar1;
  xmlEntityPtr cur;
  xmlEntityPtr ent;
  xmlChar *name_local;
  void *payload_local;
  
  entity = (xmlEntityPtr)(*xmlMalloc)(0x90);
  if (entity == (xmlEntityPtr)0x0) {
    return (void *)0x0;
  }
  memset(entity,0,0x90);
  entity->type = XML_ENTITY_DECL;
  entity->etype = *(xmlEntityType *)((long)payload + 0x5c);
  if (*(long *)((long)payload + 0x10) != 0) {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x10));
    entity->name = pxVar1;
    if (entity->name == (xmlChar *)0x0) goto LAB_00133336;
  }
  if (*(long *)((long)payload + 0x60) != 0) {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x60));
    entity->ExternalID = pxVar1;
    if (entity->ExternalID == (xmlChar *)0x0) goto LAB_00133336;
  }
  if (*(long *)((long)payload + 0x68) != 0) {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x68));
    entity->SystemID = pxVar1;
    if (entity->SystemID == (xmlChar *)0x0) goto LAB_00133336;
  }
  if (*(long *)((long)payload + 0x50) != 0) {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x50));
    entity->content = pxVar1;
    if (entity->content == (xmlChar *)0x0) goto LAB_00133336;
  }
  if (*(long *)((long)payload + 0x48) != 0) {
    pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x48));
    entity->orig = pxVar1;
    if (entity->orig == (xmlChar *)0x0) goto LAB_00133336;
  }
  if (*(long *)((long)payload + 0x78) == 0) {
    return entity;
  }
  pxVar1 = xmlStrdup(*(xmlChar **)((long)payload + 0x78));
  entity->URI = pxVar1;
  if (entity->URI != (xmlChar *)0x0) {
    return entity;
  }
LAB_00133336:
  xmlFreeEntity(entity);
  return (void *)0x0;
}

Assistant:

static void *
xmlCopyEntity(void *payload, const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlEntityPtr ent = (xmlEntityPtr) payload;
    xmlEntityPtr cur;

    cur = (xmlEntityPtr) xmlMalloc(sizeof(xmlEntity));
    if (cur == NULL)
	return(NULL);
    memset(cur, 0, sizeof(xmlEntity));
    cur->type = XML_ENTITY_DECL;

    cur->etype = ent->etype;
    if (ent->name != NULL) {
	cur->name = xmlStrdup(ent->name);
        if (cur->name == NULL)
            goto error;
    }
    if (ent->ExternalID != NULL) {
	cur->ExternalID = xmlStrdup(ent->ExternalID);
        if (cur->ExternalID == NULL)
            goto error;
    }
    if (ent->SystemID != NULL) {
	cur->SystemID = xmlStrdup(ent->SystemID);
        if (cur->SystemID == NULL)
            goto error;
    }
    if (ent->content != NULL) {
	cur->content = xmlStrdup(ent->content);
        if (cur->content == NULL)
            goto error;
    }
    if (ent->orig != NULL) {
	cur->orig = xmlStrdup(ent->orig);
        if (cur->orig == NULL)
            goto error;
    }
    if (ent->URI != NULL) {
	cur->URI = xmlStrdup(ent->URI);
        if (cur->URI == NULL)
            goto error;
    }
    return(cur);

error:
    xmlFreeEntity(cur);
    return(NULL);
}